

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O1

void __thiscall
MeCab::Param::set<std::__cxx11::string>
          (Param *this,char *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,bool rewrite)

{
  pointer pcVar1;
  iterator iVar2;
  mapped_type *this_00;
  undefined7 in_register_00000009;
  string key2;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70 [8];
  undefined8 uStack_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [8];
  undefined8 uStack_48;
  key_type local_40;
  
  std::__cxx11::string::string((string *)&local_40,key,(allocator *)&local_60);
  if ((int)CONCAT71(in_register_00000009,rewrite) == 0) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->conf_)._M_t,&local_40);
    if ((_Rb_tree_header *)iVar2._M_node != &(this->conf_)._M_t._M_impl.super__Rb_tree_header)
    goto LAB_0010e1c5;
  }
  pcVar1 = (value->_M_dataplus)._M_p;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + value->_M_string_length);
  if (local_80 == local_70) {
    uStack_48 = uStack_68;
    local_60 = local_50;
  }
  else {
    local_60 = local_80;
  }
  local_58 = local_78;
  local_78 = 0;
  local_70[0] = 0;
  local_80 = local_70;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->conf_,&local_40);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_60);
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
LAB_0010e1c5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void set(const char* key, const T &value,
           bool rewrite = true) {
    std::string key2 = std::string(key);
    if (rewrite || (!rewrite && conf_.find(key2) == conf_.end()))
      conf_[key2] = lexical_cast<std::string, T>(value);
  }